

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O2

pair bucket_get_pair(bucket b,comparable_callback compare_cb,void *key)

{
  long lVar1;
  int iVar2;
  pair ppVar3;
  ulong uVar4;
  long lVar5;
  
  if (b->pairs == (pair)0x0) {
    return (pair)0x0;
  }
  if (b->count == 0) {
LAB_001178f6:
    ppVar3 = (pair)0x0;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    lVar1 = -0x10;
    do {
      lVar5 = lVar1;
      uVar4 = uVar4 + 1;
      if (b->count <= uVar4) goto LAB_001178f6;
      ppVar3 = b->pairs;
      iVar2 = (*compare_cb)(key,*(comparable *)((long)&ppVar3[1].key + lVar5));
      lVar1 = lVar5 + 0x10;
    } while (iVar2 != 0);
    ppVar3 = (pair)((long)&ppVar3[1].key + lVar5);
  }
  return ppVar3;
}

Assistant:

pair bucket_get_pair(bucket b, comparable_callback compare_cb, void *key)
{
	size_t iterator;

	if (b->pairs == NULL || b->count == 0)
	{
		return NULL;
	}

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			return p;
		}
	}

	return NULL;
}